

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O0

_matrix<float> * __thiscall
xray_re::_matrix<float>::mul(_matrix<float> *this,_matrix<float> *a,_matrix<float> *b)

{
  _matrix<float> *b_local;
  _matrix<float> *a_local;
  _matrix<float> *this_local;
  
  if (this == a || this == b) {
    __assert_fail("this != &a && this != &b",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_matrix.h"
                  ,0xd6,
                  "_matrix<T> &xray_re::_matrix<float>::mul(const _matrix<T> &, const _matrix<T> &) [T = float]"
                 );
  }
  (this->field_0).field_0._11 =
       (a->field_0).field_0._41 * (b->field_0).field_0._14 +
       (a->field_0).field_0._31 * (b->field_0).field_0._13 +
       (a->field_0).field_0._11 * (b->field_0).field_0._11 +
       (a->field_0).field_0._21 * (b->field_0).field_0._12;
  (this->field_0).field_0._12 =
       (a->field_0).field_0._42 * (b->field_0).field_0._14 +
       (a->field_0).field_0._32 * (b->field_0).field_0._13 +
       (a->field_0).field_0._12 * (b->field_0).field_0._11 +
       (a->field_0).field_0._22 * (b->field_0).field_0._12;
  (this->field_0).field_0._13 =
       (a->field_0).field_0._43 * (b->field_0).field_0._14 +
       (a->field_0).field_0._33 * (b->field_0).field_0._13 +
       (a->field_0).field_0._13 * (b->field_0).field_0._11 +
       (a->field_0).field_0._23 * (b->field_0).field_0._12;
  (this->field_0).field_0._14 =
       (a->field_0).field_0._44 * (b->field_0).field_0._14 +
       (a->field_0).field_0._34 * (b->field_0).field_0._13 +
       (a->field_0).field_0._14 * (b->field_0).field_0._11 +
       (a->field_0).field_0._24 * (b->field_0).field_0._12;
  (this->field_0).field_0._21 =
       (a->field_0).field_0._41 * (b->field_0).field_0._24 +
       (a->field_0).field_0._31 * (b->field_0).field_0._23 +
       (a->field_0).field_0._11 * (b->field_0).field_0._21 +
       (a->field_0).field_0._21 * (b->field_0).field_0._22;
  (this->field_0).field_0._22 =
       (a->field_0).field_0._42 * (b->field_0).field_0._24 +
       (a->field_0).field_0._32 * (b->field_0).field_0._23 +
       (a->field_0).field_0._12 * (b->field_0).field_0._21 +
       (a->field_0).field_0._22 * (b->field_0).field_0._22;
  (this->field_0).field_0._23 =
       (a->field_0).field_0._43 * (b->field_0).field_0._24 +
       (a->field_0).field_0._33 * (b->field_0).field_0._23 +
       (a->field_0).field_0._13 * (b->field_0).field_0._21 +
       (a->field_0).field_0._23 * (b->field_0).field_0._22;
  (this->field_0).field_0._24 =
       (a->field_0).field_0._44 * (b->field_0).field_0._24 +
       (a->field_0).field_0._34 * (b->field_0).field_0._23 +
       (a->field_0).field_0._14 * (b->field_0).field_0._21 +
       (a->field_0).field_0._24 * (b->field_0).field_0._22;
  (this->field_0).field_0._31 =
       (a->field_0).field_0._41 * (b->field_0).field_0._34 +
       (a->field_0).field_0._31 * (b->field_0).field_0._33 +
       (a->field_0).field_0._11 * (b->field_0).field_0._31 +
       (a->field_0).field_0._21 * (b->field_0).field_0._32;
  (this->field_0).field_0._32 =
       (a->field_0).field_0._42 * (b->field_0).field_0._34 +
       (a->field_0).field_0._32 * (b->field_0).field_0._33 +
       (a->field_0).field_0._12 * (b->field_0).field_0._31 +
       (a->field_0).field_0._22 * (b->field_0).field_0._32;
  (this->field_0).field_0._33 =
       (a->field_0).field_0._43 * (b->field_0).field_0._34 +
       (a->field_0).field_0._33 * (b->field_0).field_0._33 +
       (a->field_0).field_0._13 * (b->field_0).field_0._31 +
       (a->field_0).field_0._23 * (b->field_0).field_0._32;
  (this->field_0).field_0._34 =
       (a->field_0).field_0._44 * (b->field_0).field_0._34 +
       (a->field_0).field_0._34 * (b->field_0).field_0._33 +
       (a->field_0).field_0._14 * (b->field_0).field_0._31 +
       (a->field_0).field_0._24 * (b->field_0).field_0._32;
  (this->field_0).field_0._41 =
       (a->field_0).field_0._41 * (b->field_0).field_0._44 +
       (a->field_0).field_0._31 * (b->field_0).field_0._43 +
       (a->field_0).field_0._11 * (b->field_0).field_0._41 +
       (a->field_0).field_0._21 * (b->field_0).field_0._42;
  (this->field_0).field_0._42 =
       (a->field_0).field_0._42 * (b->field_0).field_0._44 +
       (a->field_0).field_0._32 * (b->field_0).field_0._43 +
       (a->field_0).field_0._12 * (b->field_0).field_0._41 +
       (a->field_0).field_0._22 * (b->field_0).field_0._42;
  (this->field_0).field_0._43 =
       (a->field_0).field_0._43 * (b->field_0).field_0._44 +
       (a->field_0).field_0._33 * (b->field_0).field_0._43 +
       (a->field_0).field_0._13 * (b->field_0).field_0._41 +
       (a->field_0).field_0._23 * (b->field_0).field_0._42;
  (this->field_0).field_0._44 =
       (a->field_0).field_0._44 * (b->field_0).field_0._44 +
       (a->field_0).field_0._34 * (b->field_0).field_0._43 +
       (a->field_0).field_0._14 * (b->field_0).field_0._41 +
       (a->field_0).field_0._24 * (b->field_0).field_0._42;
  return this;
}

Assistant:

_matrix<T>& _matrix<T>::mul(const _matrix<T>& a, const _matrix<T>& b)
{
	assert(this != &a && this != &b);
	_11 = a._11*b._11 + a._21*b._12 + a._31*b._13 + a._41*b._14;
	_12 = a._12*b._11 + a._22*b._12 + a._32*b._13 + a._42*b._14;
	_13 = a._13*b._11 + a._23*b._12 + a._33*b._13 + a._43*b._14;
	_14 = a._14*b._11 + a._24*b._12 + a._34*b._13 + a._44*b._14;

	_21 = a._11*b._21 + a._21*b._22 + a._31*b._23 + a._41*b._24;
	_22 = a._12*b._21 + a._22*b._22 + a._32*b._23 + a._42*b._24;
	_23 = a._13*b._21 + a._23*b._22 + a._33*b._23 + a._43*b._24;
	_24 = a._14*b._21 + a._24*b._22 + a._34*b._23 + a._44*b._24;

	_31 = a._11*b._31 + a._21*b._32 + a._31*b._33 + a._41*b._34;
	_32 = a._12*b._31 + a._22*b._32 + a._32*b._33 + a._42*b._34;
	_33 = a._13*b._31 + a._23*b._32 + a._33*b._33 + a._43*b._34;
	_34 = a._14*b._31 + a._24*b._32 + a._34*b._33 + a._44*b._34;

	_41 = a._11*b._41 + a._21*b._42 + a._31*b._43 + a._41*b._44;
	_42 = a._12*b._41 + a._22*b._42 + a._32*b._43 + a._42*b._44;
	_43 = a._13*b._41 + a._23*b._42 + a._33*b._43 + a._43*b._44;
	_44 = a._14*b._41 + a._24*b._42 + a._34*b._43 + a._44*b._44;

	return *this;
}